

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall
QWidgetRepaintManager::moveStaticWidgets(QWidgetRepaintManager *this,QWidget *reparented)

{
  bool bVar1;
  QWidgetRepaintManager *pQVar2;
  long i_00;
  qsizetype qVar3;
  const_reference ppQVar4;
  QWidget *in_RSI;
  QWidgetRepaintManager *in_RDI;
  QWidget *w;
  int i;
  QWidgetRepaintManager *newPaintManager;
  QWidget *this_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar5;
  
  QWidget::d_func((QWidget *)0x3a9e16);
  pQVar2 = QWidgetPrivate::maybeRepaintManager
                     ((QWidgetPrivate *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (pQVar2 != in_RDI) {
    iVar5 = 0;
    while( true ) {
      i_00 = (long)iVar5;
      qVar3 = QList<QWidget_*>::size(&in_RDI->staticWidgets);
      if (qVar3 <= i_00) break;
      ppQVar4 = QList<QWidget_*>::at((QList<QWidget_*> *)in_RDI,i_00);
      this_00 = *ppQVar4;
      if ((in_RSI == this_00) || (bVar1 = QWidget::isAncestorOf(this_00,(QWidget *)in_RDI), bVar1))
      {
        QList<QWidget_*>::removeAt((QList<QWidget_*> *)in_RDI,i_00);
        if (pQVar2 != (QWidgetRepaintManager *)0x0) {
          addStaticWidget(in_RDI,this_00);
        }
      }
      else {
        iVar5 = iVar5 + 1;
      }
    }
  }
  return;
}

Assistant:

void QWidgetRepaintManager::moveStaticWidgets(QWidget *reparented)
{
    Q_ASSERT(reparented);
    QWidgetRepaintManager *newPaintManager = reparented->d_func()->maybeRepaintManager();
    if (newPaintManager == this)
        return;

    int i = 0;
    while (i < staticWidgets.size()) {
        QWidget *w = staticWidgets.at(i);
        if (reparented == w || reparented->isAncestorOf(w)) {
            staticWidgets.removeAt(i);
            if (newPaintManager)
                newPaintManager->addStaticWidget(w);
        } else {
            ++i;
        }
    }
}